

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O1

void __thiscall QMenuPrivate::~QMenuPrivate(QMenuPrivate *this)

{
  QMenuScroller *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  QObject *pQVar5;
  
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QMenuPrivate_00805230;
  pQVar1 = this->scroll;
  if (pQVar1 != (QMenuScroller *)0x0) {
    if ((pQVar1->scrollTimer).m_id != Invalid) {
      QBasicTimer::stop();
    }
    operator_delete(pQVar1,0xc);
  }
  pDVar2 = (this->platformMenu).wp.d;
  if ((((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
      ((this->platformMenu).wp.value != (QObject *)0x0)) &&
     (*(long *)(*(long *)((this->platformMenu).wp.value + 8) + 0x10) == 0)) {
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->platformMenu).wp.value;
    }
    if (pQVar5 != (QObject *)0x0) {
      (**(code **)(*(long *)pQVar5 + 0x20))();
    }
  }
  pDVar2 = (this->popupScreen).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->popupScreen).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->noReplayFor).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->noReplayFor).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->actionAboutToTrigger).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->actionAboutToTrigger).wp.d, pDVar2 != (Data *)0x0)
       ) {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->platformMenu).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->platformMenu).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->defaultAction).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->defaultAction).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  QMenuSloppyState::~QMenuSloppyState(&this->sloppyState);
  pDVar2 = (this->tornPopup).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->tornPopup).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->causedPopup).action.wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->causedPopup).action.wp.d, pDVar2 != (Data *)0x0))
    {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->causedPopup).widget.wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->causedPopup).widget.wp.d, pDVar2 != (Data *)0x0))
    {
      operator_delete(pDVar2);
    }
  }
  pDVar2 = (this->activeMenu).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->activeMenu).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  if ((this->searchBufferTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  pDVar3 = (this->searchBuffer).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->searchBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->syncAction).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->syncAction).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  if ((this->delayState).timer.m_id != Invalid) {
    QBasicTimer::stop();
  }
  QHash<QAction_*,_QWidget_*>::~QHash(&this->widgetItems);
  pDVar4 = (this->actionRects).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->actionRects).d.d)->super_QArrayData,0x10,0x10);
    }
  }
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

~QMenuPrivate()
    {
        delete scroll;
        if (!platformMenu.isNull() && !platformMenu->parent())
            delete platformMenu.data();
    }